

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O3

void __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::redistribute_bits
          (bt_impl<4096UL,_(bv::allocation_policy_t)0> *this,subtree_ref t,size_t begin,size_t end,
          size_t count)

{
  _Elt_pointer pbVar1;
  subtree_ref t_00;
  word_type wVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  bitview<bv::internal::bitarray_t<4096UL>::array> *pbVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t k;
  bool bVar10;
  bitview<std::vector> bits;
  ulong local_80;
  subtree_ref_base<false> local_70;
  bitview<std::vector> local_48;
  
  local_80 = count % (end - begin);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_48._container,((count >> 6) + 1) - (ulong)((count & 0x3f) == 0),
             (allocator_type *)&local_70);
  if (begin < end) {
    sVar7 = begin;
    sVar9 = 0;
    do {
      sVar4 = ((t.super_subtree_ref_base<false>._vector)->pointers)._width;
      lVar5 = ((t.super_subtree_ref_base<false>._vector)->degree + 1) *
              t.super_subtree_ref_base<false>._index;
      wVar2 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
              get(&((t.super_subtree_ref_base<false>._vector)->pointers)._bits,
                  (sVar7 + lVar5) * sVar4,(sVar7 + 1 + lVar5) * sVar4);
      sVar4 = sVar9;
      if (wVar2 != 0) {
        subtree_ref_base<false>::child(&local_70,&t.super_subtree_ref_base<false>,sVar7);
        sVar8 = local_70._size;
        subtree_ref_base<false>::child(&local_70,&t.super_subtree_ref_base<false>,sVar7);
        pbVar1 = ((local_70._vector)->leaves).
                 super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar5 = ((long)pbVar1 -
                 (long)((local_70._vector)->leaves).
                       super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first >> 9) + local_70._index;
        if (lVar5 == 0) {
          pbVar6 = pbVar1 + local_70._index;
        }
        else {
          pbVar6 = ((local_70._vector)->leaves).
                   super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node[lVar5];
        }
        sVar4 = sVar8 + sVar9;
        if (0xfff < sVar8) {
          sVar8 = 0x1000;
        }
        bitview<std::vector>::copy_forward<bv::internal::bitarray_t<4096UL>::array>
                  (&local_48,pbVar6,0,sVar8,sVar9,sVar8 + sVar9);
      }
      sVar7 = sVar7 + 1;
      sVar9 = sVar4;
    } while (end != sVar7);
  }
  t_00.super_subtree_ref_base<false>._index = t.super_subtree_ref_base<false>._index;
  t_00.super_subtree_ref_base<false>._vector = t.super_subtree_ref_base<false>._vector;
  t_00.super_subtree_ref_base<false>._height = t.super_subtree_ref_base<false>._height;
  t_00.super_subtree_ref_base<false>._size = t.super_subtree_ref_base<false>._size;
  t_00.super_subtree_ref_base<false>._rank = t.super_subtree_ref_base<false>._rank;
  clear_children_counters(this,t_00,begin,end);
  if (begin < end) {
    sVar7 = 0;
    sVar9 = begin;
    do {
      bVar10 = local_80 == 0;
      uVar3 = local_80 - 1;
      local_80 = 0;
      if (!bVar10) {
        local_80 = uVar3;
      }
      uVar3 = (count / (end - begin) + 1) - (ulong)bVar10;
      sVar4 = ((t.super_subtree_ref_base<false>._vector)->pointers)._width;
      lVar5 = ((t.super_subtree_ref_base<false>._vector)->degree + 1) *
              t.super_subtree_ref_base<false>._index;
      wVar2 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
              get(&((t.super_subtree_ref_base<false>._vector)->pointers)._bits,
                  (sVar9 + lVar5) * sVar4,(sVar9 + 1 + lVar5) * sVar4);
      if (wVar2 == 0) {
        subtree_ref::insert_child((subtree_ref *)&t.super_subtree_ref_base<false>,sVar9);
      }
      subtree_ref_base<false>::child(&local_70,&t.super_subtree_ref_base<false>,sVar9);
      pbVar1 = ((local_70._vector)->leaves).
               super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      lVar5 = ((long)pbVar1 -
               (long)((local_70._vector)->leaves).
                     super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first >> 9) + local_70._index;
      if (lVar5 == 0) {
        pbVar6 = pbVar1 + local_70._index;
      }
      else {
        pbVar6 = ((local_70._vector)->leaves).
                 super__Deque_base<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node[lVar5];
      }
      (pbVar6->_container)._M_elems[0x38] = 0;
      (pbVar6->_container)._M_elems[0x39] = 0;
      (pbVar6->_container)._M_elems[0x3a] = 0;
      (pbVar6->_container)._M_elems[0x3b] = 0;
      (pbVar6->_container)._M_elems[0x3c] = 0;
      (pbVar6->_container)._M_elems[0x3d] = 0;
      (pbVar6->_container)._M_elems[0x3e] = 0;
      (pbVar6->_container)._M_elems[0x3f] = 0;
      (pbVar6->_container)._M_elems[0x30] = 0;
      (pbVar6->_container)._M_elems[0x31] = 0;
      (pbVar6->_container)._M_elems[0x32] = 0;
      (pbVar6->_container)._M_elems[0x33] = 0;
      (pbVar6->_container)._M_elems[0x34] = 0;
      (pbVar6->_container)._M_elems[0x35] = 0;
      (pbVar6->_container)._M_elems[0x36] = 0;
      (pbVar6->_container)._M_elems[0x37] = 0;
      (pbVar6->_container)._M_elems[0x28] = 0;
      (pbVar6->_container)._M_elems[0x29] = 0;
      (pbVar6->_container)._M_elems[0x2a] = 0;
      (pbVar6->_container)._M_elems[0x2b] = 0;
      (pbVar6->_container)._M_elems[0x2c] = 0;
      (pbVar6->_container)._M_elems[0x2d] = 0;
      (pbVar6->_container)._M_elems[0x2e] = 0;
      (pbVar6->_container)._M_elems[0x2f] = 0;
      (pbVar6->_container)._M_elems[0x20] = 0;
      (pbVar6->_container)._M_elems[0x21] = 0;
      (pbVar6->_container)._M_elems[0x22] = 0;
      (pbVar6->_container)._M_elems[0x23] = 0;
      (pbVar6->_container)._M_elems[0x24] = 0;
      (pbVar6->_container)._M_elems[0x25] = 0;
      (pbVar6->_container)._M_elems[0x26] = 0;
      (pbVar6->_container)._M_elems[0x27] = 0;
      (pbVar6->_container)._M_elems[0x18] = 0;
      (pbVar6->_container)._M_elems[0x19] = 0;
      (pbVar6->_container)._M_elems[0x1a] = 0;
      (pbVar6->_container)._M_elems[0x1b] = 0;
      (pbVar6->_container)._M_elems[0x1c] = 0;
      (pbVar6->_container)._M_elems[0x1d] = 0;
      (pbVar6->_container)._M_elems[0x1e] = 0;
      (pbVar6->_container)._M_elems[0x1f] = 0;
      (pbVar6->_container)._M_elems[0x10] = 0;
      (pbVar6->_container)._M_elems[0x11] = 0;
      (pbVar6->_container)._M_elems[0x12] = 0;
      (pbVar6->_container)._M_elems[0x13] = 0;
      (pbVar6->_container)._M_elems[0x14] = 0;
      (pbVar6->_container)._M_elems[0x15] = 0;
      (pbVar6->_container)._M_elems[0x16] = 0;
      (pbVar6->_container)._M_elems[0x17] = 0;
      (pbVar6->_container)._M_elems[8] = 0;
      (pbVar6->_container)._M_elems[9] = 0;
      (pbVar6->_container)._M_elems[10] = 0;
      (pbVar6->_container)._M_elems[0xb] = 0;
      (pbVar6->_container)._M_elems[0xc] = 0;
      (pbVar6->_container)._M_elems[0xd] = 0;
      (pbVar6->_container)._M_elems[0xe] = 0;
      (pbVar6->_container)._M_elems[0xf] = 0;
      (pbVar6->_container)._M_elems[0] = 0;
      (pbVar6->_container)._M_elems[1] = 0;
      (pbVar6->_container)._M_elems[2] = 0;
      (pbVar6->_container)._M_elems[3] = 0;
      (pbVar6->_container)._M_elems[4] = 0;
      (pbVar6->_container)._M_elems[5] = 0;
      (pbVar6->_container)._M_elems[6] = 0;
      (pbVar6->_container)._M_elems[7] = 0;
      sVar4 = 0x1000;
      if (uVar3 < 0x1000) {
        sVar4 = uVar3;
      }
      sVar8 = sVar7 + 0x1000;
      if (uVar3 < 0x1001) {
        sVar8 = uVar3 + sVar7;
      }
      bitview<bv::internal::bitarray_t<4096UL>::array>::copy_forward<std::vector>
                (pbVar6,&local_48,sVar7,sVar8,0,sVar4);
      lVar5 = (t.super_subtree_ref_base<false>._vector)->degree *
              t.super_subtree_ref_base<false>._index;
      packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
      increment(&(t.super_subtree_ref_base<false>._vector)->sizes,sVar9 + lVar5,lVar5 + this->degree
                ,uVar3,cant_overflow);
      sVar4 = bitview<bv::internal::bitarray_t<4096UL>::array>::popcount(pbVar6,0,0x1000);
      lVar5 = (t.super_subtree_ref_base<false>._vector)->degree *
              t.super_subtree_ref_base<false>._index;
      packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
      increment(&(t.super_subtree_ref_base<false>._vector)->ranks,sVar9 + lVar5,lVar5 + this->degree
                ,sVar4,cant_overflow);
      sVar9 = sVar9 + 1;
      sVar7 = uVar3 + sVar7;
    } while (end != sVar9);
    if ((0x1000 - this->buffer) * this->buffer <= this->size && begin < end) {
      do {
        subtree_ref_base<false>::child(&local_70,&t.super_subtree_ref_base<false>,begin);
        begin = begin + 1;
      } while (end != begin);
    }
  }
  if (local_48._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48._container.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void bt_impl<W, AP>::redistribute_bits(subtree_ref t,
                                               size_t begin, size_t end,
                                               size_t count)
        {
            size_t b = end - begin; // Number of children to use
            size_t bits_per_leaf = count / b; // Average number of bits per leaf
            size_t rem           = count % b; // Remainder
            
            assert(b == buffer || b == buffer + 1);
            
            // Here we use the existing abstraction of packed_view
            // to accumulate all the bits into a temporary buffer, and
            // subsequently redistribute them to the leaves
            bitview<std::vector> bits(count);
            
            for(size_t i = begin, p = 0; i < end; ++i) {
                if(t.pointers(i) != 0) {
                    size_t step = t.child(i).size();
                    leaf_reference leaf = t.child(i).leaf();
                    bits(p, p + step) = leaf(0, leaf.size());
                    p += step;
                }
            }
            
            clear_children_counters(t, begin, end);
            
            // The redistribution begins.
            for(size_t p = 0, i = begin; i < end; ++i)
            {
                // The remainder is evenly distributed between the first leaves
                size_t n = bits_per_leaf;
                if(rem) {
                    n += 1;
                    rem -= 1;
                }
                
                // Here we take into account the first steps, when
                // we have an empty root to fill up. If we're going to use
                // a children that doesn't exist, we create it.
                //FIXME: remove insert_child() like in redistribute_keys?
                if(t.pointers(i) == 0)
                    t.insert_child(i);
                
                // Take the bits out of the buffer, put them back into the leaf
                leaf_reference leaf = t.child(i).leaf();
                leaf.clear();
                leaf(0, leaf.size()) = bits(p, p + n);
                
                // Increment the counters
                t.sizes(i, degree) += n;
                t.ranks(i, degree) += leaf.popcount();
                
                // Count of the copied bits
                p += n;
                count -= n;
            }
            
            assert(count == 0);
            // This is debug code
            // It's important to stay in shape and not get too fat
            if(size >= (buffer * (leaf_bits - buffer))) {
                for(size_t k = begin; k < end; ++k) {
                    size_t minsize = (buffer *
                                      (leaf_bits - buffer)) /
                                     (buffer + 1);
                    size_t childsize = t.child(k).size();
                    assert(childsize >= minsize);
                    unused(minsize, childsize);
                }
            }
        }